

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool fs_create_directory_with_parents(string *path)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  string subpath;
  stat info_1;
  stat info;
  long *local_170 [2];
  long local_160 [2];
  stat local_150;
  stat local_c0;
  
  iVar2 = stat((path->_M_dataplus)._M_p,&local_c0);
  if (iVar2 == 0) {
    bVar4 = (local_c0.st_mode & 0xf000) == 0x4000;
  }
  else {
    do {
      lVar3 = std::__cxx11::string::find((char)path,0x2f);
      bVar4 = lVar3 == -1;
      if (bVar4) {
        return bVar4;
      }
      std::__cxx11::string::substr((ulong)local_170,(ulong)path);
      iVar2 = stat((char *)local_170[0],&local_150);
      if (iVar2 == 0) {
        if ((local_150.st_mode & 0xf000) == 0x4000) goto LAB_001383a2;
LAB_0013838b:
        bVar1 = false;
      }
      else {
        iVar2 = mkdir((char *)local_170[0],0x1ed);
        if (iVar2 != 0) goto LAB_0013838b;
LAB_001383a2:
        bVar1 = true;
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
    } while (bVar1);
  }
  return bVar4;
}

Assistant:

bool fs_create_directory_with_parents(const std::string & path) {
#ifdef _WIN32
    std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
    std::wstring wpath = converter.from_bytes(path);

    // if the path already exists, check whether it's a directory
    const DWORD attributes = GetFileAttributesW(wpath.c_str());
    if ((attributes != INVALID_FILE_ATTRIBUTES) && (attributes & FILE_ATTRIBUTE_DIRECTORY)) {
        return true;
    }

    size_t pos_slash = 0;

    // process path from front to back, procedurally creating directories
    while ((pos_slash = path.find('\\', pos_slash)) != std::string::npos) {
        const std::wstring subpath = wpath.substr(0, pos_slash);
        const wchar_t * test = subpath.c_str();

        const bool success = CreateDirectoryW(test, NULL);
        if (!success) {
            const DWORD error = GetLastError();

            // if the path already exists, ensure that it's a directory
            if (error == ERROR_ALREADY_EXISTS) {
                const DWORD attributes = GetFileAttributesW(subpath.c_str());
                if (attributes == INVALID_FILE_ATTRIBUTES || !(attributes & FILE_ATTRIBUTE_DIRECTORY)) {
                    return false;
                }
            } else {
                return false;
            }
        }

        pos_slash += 1;
    }

    return true;
#else
    // if the path already exists, check whether it's a directory
    struct stat info;
    if (stat(path.c_str(), &info) == 0) {
        return S_ISDIR(info.st_mode);
    }

    size_t pos_slash = 1; // skip leading slashes for directory creation

    // process path from front to back, procedurally creating directories
    while ((pos_slash = path.find('/', pos_slash)) != std::string::npos) {
        const std::string subpath = path.substr(0, pos_slash);
        struct stat info;

        // if the path already exists, ensure that it's a directory
        if (stat(subpath.c_str(), &info) == 0) {
            if (!S_ISDIR(info.st_mode)) {
                return false;
            }
        } else {
            // create parent directories
            const int ret = mkdir(subpath.c_str(), 0755);
            if (ret != 0) {
                return false;
            }
        }

        pos_slash += 1;
    }

    return true;
#endif // _WIN32
}